

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void Adam7_getpassvalues(uint *passw,uint *passh,size_t *filter_passstart,size_t *padded_passstart,
                        size_t *passstart,uint w,uint h,uint bpp)

{
  uint local_44;
  uint local_38;
  uint i;
  uint w_local;
  size_t *passstart_local;
  size_t *padded_passstart_local;
  size_t *filter_passstart_local;
  uint *passh_local;
  uint *passw_local;
  
  for (local_38 = 0; local_38 != 7; local_38 = local_38 + 1) {
    passw[local_38] = (((w + ADAM7_DX[local_38]) - ADAM7_IX[local_38]) - 1) / ADAM7_DX[local_38];
    passh[local_38] = (((h + ADAM7_DY[local_38]) - ADAM7_IY[local_38]) - 1) / ADAM7_DY[local_38];
    if (passw[local_38] == 0) {
      passh[local_38] = 0;
    }
    if (passh[local_38] == 0) {
      passw[local_38] = 0;
    }
  }
  *passstart = 0;
  *padded_passstart = 0;
  *filter_passstart = 0;
  for (local_38 = 0; local_38 != 7; local_38 = local_38 + 1) {
    if ((passw[local_38] == 0) || (passh[local_38] == 0)) {
      local_44 = 0;
    }
    else {
      local_44 = passh[local_38] * ((passw[local_38] * bpp + 7 >> 3) + 1);
    }
    filter_passstart[local_38 + 1] = filter_passstart[local_38] + (ulong)local_44;
    padded_passstart[local_38 + 1] =
         padded_passstart[local_38] + (ulong)(passh[local_38] * (passw[local_38] * bpp + 7 >> 3));
    passstart[local_38 + 1] =
         passstart[local_38] + (ulong)(passh[local_38] * passw[local_38] * bpp + 7 >> 3);
  }
  return;
}

Assistant:

static void Adam7_getpassvalues(unsigned passw[7], unsigned passh[7], size_t filter_passstart[8],
                                size_t padded_passstart[8], size_t passstart[8], unsigned w, unsigned h, unsigned bpp) {
  /*the passstart values have 8 values: the 8th one indicates the byte after the end of the 7th (= last) pass*/
  unsigned i;

  /*calculate width and height in pixels of each pass*/
  for(i = 0; i != 7; ++i) {
    passw[i] = (w + ADAM7_DX[i] - ADAM7_IX[i] - 1) / ADAM7_DX[i];
    passh[i] = (h + ADAM7_DY[i] - ADAM7_IY[i] - 1) / ADAM7_DY[i];
    if(passw[i] == 0) passh[i] = 0;
    if(passh[i] == 0) passw[i] = 0;
  }

  filter_passstart[0] = padded_passstart[0] = passstart[0] = 0;
  for(i = 0; i != 7; ++i) {
    /*if passw[i] is 0, it's 0 bytes, not 1 (no filtertype-byte)*/
    filter_passstart[i + 1] = filter_passstart[i]
                            + ((passw[i] && passh[i]) ? passh[i] * (1u + (passw[i] * bpp + 7u) / 8u) : 0);
    /*bits padded if needed to fill full byte at end of each scanline*/
    padded_passstart[i + 1] = padded_passstart[i] + passh[i] * ((passw[i] * bpp + 7u) / 8u);
    /*only padded at end of reduced image*/
    passstart[i + 1] = passstart[i] + (passh[i] * passw[i] * bpp + 7u) / 8u;
  }
}